

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::SubroutineUniform::SubroutineUniform
          (SubroutineUniform *this,UniformValueGenerator *generator,
          SubroutineFunctionSet *_functions,Loc _location,int _arraySize,DefOccurence _defOccurence,
          bool _used)

{
  int *__x;
  int iVar1;
  pointer pSVar2;
  pointer piVar3;
  pointer pSVar4;
  long lVar5;
  UniformType UStack_198;
  UniformValue local_108;
  
  SubroutineFunctionSet::SubroutineFunctionSet(&this->functions,_functions);
  (this->location).super_LayoutSpecifierBase.val = (int)_location.super_LayoutSpecifierBase._0_8_;
  (this->location).super_LayoutSpecifierBase.numSys =
       (int)((ulong)_location.super_LayoutSpecifierBase._0_8_ >> 0x20);
  (this->location).super_LayoutSpecifierBase.occurence.occurence =
       _location.super_LayoutSpecifierBase.occurence.occurence.occurence;
  this->arraySize = _arraySize;
  (this->defOccurence).occurence = _defOccurence.occurence;
  this->used = _used;
  (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->arraySizesSegmented).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UniformType::UniformType((UniformType *)&local_108,0x1405,0);
  UniformValue::UniformValue(&this->embeddedUIntUniform,(UniformType *)&local_108,generator);
  __x = &this->arraySize;
  UniformType::~UniformType((UniformType *)&local_108);
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  iVar1 = this->arraySize;
  if (-1 < iVar1) {
    if (iVar1 == 0) {
      *__x = 1;
    }
    this->isArray = iVar1 != 0;
    std::vector<int,_std::allocator<int>_>::push_back(&this->arraySizesSegmented,__x);
    UniformType::UniformType(&UStack_198,0x1405,*__x);
    UniformValue::UniformValue(&local_108,&UStack_198,generator);
    UniformValue::operator=(&this->embeddedUIntUniform,&local_108);
    UniformValue::~UniformValue(&local_108);
    UniformType::~UniformType(&UStack_198);
    pSVar2 = (this->functions).fn.
             super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    piVar3 = (this->embeddedUIntUniform).uValues.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pSVar4 = (this->functions).fn.
             super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (lVar5 = 0; lVar5 < *__x; lVar5 = lVar5 + 1) {
      piVar3[lVar5] =
           (int)((ulong)(long)piVar3[lVar5] % (ulong)(((long)pSVar2 - (long)pSVar4) / 0x108));
    }
    return;
  }
  __assert_fail("arraySize >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                ,0x32a,
                "glcts::(anonymous namespace)::SubroutineUniform::SubroutineUniform(UniformValueGenerator &, SubroutineFunctionSet &, Loc, int, DefOccurence, bool)"
               );
}

Assistant:

SubroutineUniform(UniformValueGenerator& generator, SubroutineFunctionSet& _functions, Loc _location,
					  int _arraySize = 0, DefOccurence _defOccurence = DefOccurence::ALL_SH, bool _used = true)
		: functions(_functions)
		, location(_location)
		, arraySize(_arraySize)
		, defOccurence(_defOccurence)
		, used(_used)
		, embeddedUIntUniform(GL_UNSIGNED_INT, generator)
	{

		assert(arraySize >= 0);

		if (!arraySize)
		{
			arraySize = 1;
			isArray   = false;
		}
		else
		{
			isArray = true;
		}

		arraySizesSegmented.push_back(arraySize);

		embeddedUIntUniform = UniformValue(UniformType(GL_UNSIGNED_INT, arraySize), generator);
		for (int i = 0; i < arraySize; i++)
		{
			embeddedUIntUniform.uValues[i] = static_cast<GLint>(embeddedUIntUniform.uValues[i] % functions.fn.size());
		}
	}